

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O2

void mkcavearea(boolean rockit)

{
  undefined1 *puVar1;
  bool bVar2;
  level *plVar3;
  byte bVar4;
  xchar xVar5;
  int iVar6;
  char cVar7;
  xchar xVar8;
  ulong uVar9;
  char cVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  ulong in_R8;
  byte bVar15;
  ulong uVar16;
  char local_4e;
  char local_4d;
  ulong local_48;
  ulong local_40;
  
  local_4d = u.uy;
  local_4e = u.ux;
  local_40 = (ulong)u.ux;
  local_48 = (ulong)u.uy;
  cVar10 = level->locations[local_40][local_48].typ;
  if ((cVar10 == '\x19') && ((level->locations[local_40][local_48].field_0x7 & 8) != 0)) {
LAB_00165c90:
    bVar15 = 1;
    bVar2 = false;
  }
  else {
    uVar14 = (int)u.uy + 2;
    in_R8 = (ulong)uVar14;
    uVar9 = (ulong)((int)u.ux - 2);
    while (cVar7 = (char)uVar9, (int)cVar7 < u.ux + 3) {
      uVar16 = (ulong)((int)u.uy - 1);
      while (bVar15 = (byte)uVar16, (int)(char)bVar15 < (int)uVar14) {
        if ((bVar15 < 0x15 && (byte)(cVar7 - 1U) < 0x4f) &&
           ((level->locations[uVar9 & 0xff][uVar16 & 0xff].field_0x7 & 8) != 0)) goto LAB_00165c90;
        uVar16 = (ulong)(byte)(bVar15 + 1);
      }
      uVar9 = (ulong)(byte)(cVar7 + 1);
    }
    bVar2 = true;
    bVar15 = 0;
  }
  if (rockit == '\0') {
    pcVar11 = "extends the";
    if (cVar10 == '\x18') {
      pcVar11 = "creates a";
    }
    pline("A mysterious force %s cave around you!",pcVar11);
  }
  else {
    pline("Crash!  The ceiling collapses around you!");
  }
  (*windowprocs.win_pause)(P_MESSAGE);
  uVar14 = (uint)bVar15;
  for (iVar6 = 1; plVar3 = level, xVar8 = u.uy, xVar5 = u.ux, iVar6 != 3; iVar6 = iVar6 + 1) {
    local_4e = local_4e + '\x01';
    if (iVar6 != 2) {
      bVar4 = (char)local_48 - 1;
      local_48 = (ulong)bVar4;
      local_4d = local_4d + '\x01';
      uVar9 = local_40 & 0xffffffff;
      while (cVar10 = (char)uVar9, cVar10 < local_4e) {
        mkcavepos(cVar10,bVar4,uVar14,rockit,(boolean)in_R8);
        mkcavepos(cVar10,local_4d,uVar14,rockit,(boolean)in_R8);
        uVar9 = (ulong)(byte)(cVar10 + 1);
      }
    }
    bVar4 = (char)local_40 - 1;
    local_40 = (ulong)bVar4;
    uVar9 = local_48 & 0xffffffff;
    while (cVar10 = (char)uVar9, cVar10 <= local_4d) {
      mkcavepos(bVar4,cVar10,uVar14,rockit,(boolean)in_R8);
      mkcavepos(local_4e,cVar10,(uint)bVar15,rockit,(boolean)in_R8);
      uVar9 = (ulong)(byte)(cVar10 + 1);
    }
    flush_screen();
    (*windowprocs.win_delay)();
  }
  if (rockit == '\0') {
    lVar12 = (long)u.ux;
    lVar13 = (long)u.uy;
    if (level->locations[lVar12][lVar13].typ == '\x18') {
      level->locations[lVar12][lVar13].typ = '\x19';
      if (!bVar2) {
        puVar1 = &plVar3->locations[lVar12][lVar13].field_0x7;
        *puVar1 = *puVar1 | 8;
        xVar5 = u.ux;
        xVar8 = u.uy;
      }
      newsym((int)xVar5,(int)xVar8);
    }
  }
  vision_full_recalc = '\x01';
  return;
}

Assistant:

static void mkcavearea(boolean rockit)
{
    int dist;
    xchar xmin = u.ux, xmax = u.ux;
    xchar ymin = u.uy, ymax = u.uy;
    xchar i;
    boolean waslit = rm_waslit();

    if (rockit) pline("Crash!  The ceiling collapses around you!");
    else pline("A mysterious force %s cave around you!",
	     (level->locations[u.ux][u.uy].typ == CORR) ? "creates a" : "extends the");
    win_pause_output(P_MESSAGE);

    for (dist = 1; dist <= 2; dist++) {
	xmin--; xmax++;

	/* top and bottom */
	if (dist < 2) { /* the area is wider that it is high */
	    ymin--; ymax++;
	    for (i = xmin+1; i < xmax; i++) {
		mkcavepos(i, ymin, dist, waslit, rockit);
		mkcavepos(i, ymax, dist, waslit, rockit);
	    }
	}

	/* left and right */
	for (i = ymin; i <= ymax; i++) {
	    mkcavepos(xmin, i, dist, waslit, rockit);
	    mkcavepos(xmax, i, dist, waslit, rockit);
	}

	flush_screen();	/* make sure the new glyphs shows up */
	win_delay_output();
    }

    if (!rockit && level->locations[u.ux][u.uy].typ == CORR) {
	level->locations[u.ux][u.uy].typ = ROOM;
	if (waslit) level->locations[u.ux][u.uy].waslit = TRUE;
	newsym(u.ux, u.uy); /* in case player is invisible */
    }

    vision_full_recalc = 1;	/* everything changed */
}